

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidgetPrivate::clearConnections(QListWidgetPrivate *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    QObject::disconnect((Connection *)
                        (&((array<QMetaObject::Connection,_8UL> *)
                          (&this->selectionModelConnections + -4))->field_0x0 + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  lVar1 = 0;
  do {
    QObject::disconnect((Connection *)
                        ((long)&(this->selectionModelConnections)._M_elems[0].d_ptr + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void QListWidgetPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : connections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : selectionModelConnections)
        QObject::disconnect(connection);
}